

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_thread.h
# Opt level: O2

void DrawerCommandQueue::QueueCommand<swrenderer::DrawSpanPalCommand>(void)

{
  DrawerCommandQueue *this;
  DrawSpanPalCommand *this_00;
  DrawSpanPalCommand command;
  
  this = Instance();
  if ((this->threaded_render == 0) || (r_multithreaded.Value == false)) {
    command.super_PalSpanCommand._srcblend = (uint32_t *)0x0;
    command.super_PalSpanCommand._destblend = (uint32_t *)0x0;
    command.super_PalSpanCommand._xstep = 0;
    command.super_PalSpanCommand._ystep = 0;
    command.super_PalSpanCommand._xbits = 0;
    command.super_PalSpanCommand._ybits = 0;
    command.super_PalSpanCommand._x2 = 0;
    command.super_PalSpanCommand._52_4_ = 0;
    command.super_PalSpanCommand._destorg = (uint8_t *)0x0;
    command.super_PalSpanCommand._xfrac = 0;
    command.super_PalSpanCommand._yfrac = 0;
    command.super_PalSpanCommand._y = 0;
    command.super_PalSpanCommand._x1 = 0;
    command.super_PalSpanCommand._source = (uint8_t *)0x0;
    command.super_PalSpanCommand._colormap = (uint8_t *)0x0;
    command.super_PalSpanCommand.super_DrawerCommand._vptr_DrawerCommand = (_func_int **)0x0;
    command.super_PalSpanCommand.super_DrawerCommand._dest_y = 0;
    command.super_PalSpanCommand.super_DrawerCommand._12_4_ = 0;
    command.super_PalSpanCommand._color = 0;
    command.super_PalSpanCommand._100_4_ = 0;
    swrenderer::DrawSpanPalCommand::DrawSpanPalCommand(&command);
    VectoredTryCatch(&command,QueueCommand<swrenderer::DrawSpanPalCommand>::anon_class_1_0_00000001
                              ::__invoke,
                     QueueCommand<swrenderer::DrawSpanPalCommand>::anon_class_1_0_00000001::__invoke
                    );
  }
  else {
    this_00 = (DrawSpanPalCommand *)AllocMemory(0x68);
    if (this_00 == (DrawSpanPalCommand *)0x0) {
      Finish(this);
      this_00 = (DrawSpanPalCommand *)AllocMemory(0x68);
      if (this_00 == (DrawSpanPalCommand *)0x0) {
        return;
      }
    }
    (this_00->super_PalSpanCommand)._srcblend = (uint32_t *)0x0;
    (this_00->super_PalSpanCommand)._destblend = (uint32_t *)0x0;
    (this_00->super_PalSpanCommand)._xstep = 0;
    (this_00->super_PalSpanCommand)._ystep = 0;
    (this_00->super_PalSpanCommand)._xbits = 0;
    (this_00->super_PalSpanCommand)._ybits = 0;
    *(undefined8 *)&(this_00->super_PalSpanCommand)._x2 = 0;
    (this_00->super_PalSpanCommand)._destorg = (uint8_t *)0x0;
    (this_00->super_PalSpanCommand)._xfrac = 0;
    (this_00->super_PalSpanCommand)._yfrac = 0;
    (this_00->super_PalSpanCommand)._y = 0;
    (this_00->super_PalSpanCommand)._x1 = 0;
    (this_00->super_PalSpanCommand)._source = (uint8_t *)0x0;
    (this_00->super_PalSpanCommand)._colormap = (uint8_t *)0x0;
    (this_00->super_PalSpanCommand).super_DrawerCommand._vptr_DrawerCommand = (_func_int **)0x0;
    *(undefined8 *)&(this_00->super_PalSpanCommand).super_DrawerCommand._dest_y = 0;
    *(undefined8 *)&(this_00->super_PalSpanCommand)._color = 0;
    swrenderer::DrawSpanPalCommand::DrawSpanPalCommand(this_00);
    command.super_PalSpanCommand.super_DrawerCommand._vptr_DrawerCommand = (_func_int **)this_00;
    std::vector<DrawerCommand*,std::allocator<DrawerCommand*>>::emplace_back<DrawerCommand*>
              ((vector<DrawerCommand*,std::allocator<DrawerCommand*>> *)&this->commands,
               (DrawerCommand **)&command);
  }
  return;
}

Assistant:

static void QueueCommand(Types &&... args)
	{
		auto queue = Instance();
		if (queue->threaded_render == 0 || !r_multithreaded)
		{
			T command(std::forward<Types>(args)...);
			VectoredTryCatch(&command,
			[](void *data)
			{
				T *c = (T*)data;
				c->Execute(&Instance()->single_core_thread);
			},
			[](void *data, const char *reason, bool fatal)
			{
				T *c = (T*)data;
				ReportDrawerError(c, false, reason, fatal);
			});
		}
		else
		{
			void *ptr = AllocMemory(sizeof(T));
			if (!ptr) // Out of memory - render what we got
			{
				queue->Finish();
				ptr = AllocMemory(sizeof(T));
				if (!ptr)
					return;
			}
			T *command = new (ptr)T(std::forward<Types>(args)...);
			queue->commands.push_back(command);
		}
	}